

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_chunk.cpp
# Opt level: O1

void __thiscall
duckdb::DataChunk::Hash(DataChunk *this,vector<unsigned_long,_true> *column_ids,Vector *result)

{
  reference pvVar1;
  reference pvVar2;
  size_type __n;
  
  pvVar1 = vector<unsigned_long,_true>::operator[](column_ids,0);
  pvVar2 = vector<duckdb::Vector,_true>::operator[](&this->data,*pvVar1);
  VectorOperations::Hash(pvVar2,result,this->count);
  if (8 < (ulong)((long)(column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(column_ids->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start)) {
    __n = 1;
    do {
      pvVar1 = vector<unsigned_long,_true>::operator[](column_ids,__n);
      pvVar2 = vector<duckdb::Vector,_true>::operator[](&this->data,*pvVar1);
      VectorOperations::CombineHash(result,pvVar2,this->count);
      __n = __n + 1;
    } while (__n < (ulong)((long)(column_ids->
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(column_ids->
                                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void DataChunk::Hash(vector<idx_t> &column_ids, Vector &result) {
	D_ASSERT(result.GetType().id() == LogicalType::HASH);
	D_ASSERT(!column_ids.empty());

	VectorOperations::Hash(data[column_ids[0]], result, size());
	for (idx_t i = 1; i < column_ids.size(); i++) {
		VectorOperations::CombineHash(result, data[column_ids[i]], size());
	}
}